

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O2

void __thiscall tst_helpers_reduce::delayedRejected(tst_helpers_reduce *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  bool bVar3;
  PromiseData<int> *pPVar4;
  PromiseResolver<int> *pPVar5;
  QPromiseReject<int> *in_R8;
  int iVar6;
  int *piVar7;
  initializer_list<int> args;
  initializer_list<int> args_00;
  initializer_list<int> args_01;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_218;
  Type p1;
  QArrayDataPointer<char16_t> local_200;
  anon_class_64_3_a63a5800 local_1e8;
  anon_class_48_4_6432c65f local_1a8;
  Type p0;
  QPromiseBase<int> local_160;
  long local_150;
  PromiseResolver<int> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_140;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_138;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_128;
  int *local_120;
  function<void_(const_int_&)> local_118;
  QVector<int> inputs;
  QVector<int> v1;
  QVector<int> v0;
  int local_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  Type input;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_50;
  
  local_1e8.resolve.m_resolver.m_d.d =
       (PromiseResolver<int>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x600000004;
  local_1e8.reject.m_resolver.m_d.d._0_4_ = 8;
  args._M_len = 3;
  args._M_array = (iterator)&local_1e8;
  QList<int>::QList(&inputs,args);
  piVar7 = inputs.d.ptr;
  v0.d.d = (Data *)0x0;
  v0.d.ptr = (int *)0x0;
  v0.d.size = 0;
  v1.d.d = (Data *)0x0;
  v1.d.ptr = (int *)0x0;
  v1.d.size = 0;
  QtPromise::resolve<int_const&>((QtPromise *)&p0,inputs.d.ptr);
  local_150 = CONCAT44(local_150._4_4_,1);
  while (piVar7 = piVar7 + 1, piVar7 != inputs.d.ptr + inputs.d.size) {
    QtPromise::resolve<int_const&>((QtPromise *)&input.super_QPromiseBase<int>,piVar7);
    local_1a8.input.super_QPromiseBase<int>.m_d.d = input.super_QPromiseBase<int>.m_d.d;
    if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1a8.fn.called = (bool *)&v0;
    local_1a8.promise.super_QPromiseBase<int>.m_d.d = p0.super_QPromiseBase<int>.m_d.d;
    if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1a8.idx = (int)local_150;
    local_200.d = (Data *)&PTR__QPromiseBase_001348c0;
    local_120 = piVar7;
    pPVar4 = (PromiseData<int> *)operator_new(0x68);
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar4);
    LOCK();
    pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar4 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_118.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00134920;
    local_200.ptr = (char16_t *)pPVar4;
    local_118.super__Function_base._M_functor._8_8_ = pPVar4;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_118);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_118);
    QVar2 = p0.super_QPromiseBase<int>.m_d;
    if (resolver.m_d.d == (Data *)0x0) {
      local_1e8.resolve.m_resolver.m_d.d =
           (PromiseResolver<int>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0;
    }
    else {
      LOCK();
      *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
      UNLOCK();
      local_1e8.resolve.m_resolver = resolver;
    }
    p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
    if (local_1e8.resolve.m_resolver.m_d.d ==
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
    }
    else {
      LOCK();
      (((Data *)local_1e8.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
      super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((Data *)local_1e8.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           local_1e8.resolve.m_resolver.m_d.d;
    }
    local_218.d = (Data *)0x0;
    if (local_1e8.resolve.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      (((Data *)local_1e8.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
      super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i = (((Data *)local_1e8.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
             super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (resolver_1.m_d.d != (Data *)0x0) {
      LOCK();
      (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)resolver_1.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.input.super_QPromiseBase<int>.m_d.d =
         local_1a8.input.super_QPromiseBase<int>.m_d.d;
    if (local_1a8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_1a8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1e8.handler.fn.v1 = (QVector<int> *)local_1a8.fn.called;
    local_1e8.handler.promise.super_QPromiseBase<int>.m_d.d =
         local_1a8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_1a8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_1a8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1e8.handler.idx = local_1a8.idx;
    local_98._M_unused._M_object = (void *)0x0;
    local_98._8_8_ = 0;
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_1e8.reject.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)resolver_1.m_d.d
    ;
    local_160._vptr_QPromiseBase = (_func_int **)local_1e8.resolve.m_resolver.m_d.d;
    pPVar5 = (PromiseResolver<int> *)operator_new(0x40);
    pPVar5->m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                  local_1e8.resolve.m_resolver.m_d.d;
    if (local_1e8.resolve.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_1e8.resolve.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_1e8.resolve.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    pPVar5[1].m_d.d = (Data *)local_1e8.reject.m_resolver.m_d.d;
    if (local_1e8.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_1e8.reject.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_1e8.reject.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              ((anon_class_48_4_6432c65f_conflict *)(pPVar5 + 2),
               (anon_class_48_4_6432c65f_conflict *)&local_1e8.handler);
    pcStack_80 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    local_98._M_unused._0_8_ = (undefined8)pPVar5;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              (&local_1e8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_int_&)> *)&local_98);
    std::_Function_base::~_Function_base((_Function_base *)&local_98);
    QVar2 = p0.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              (&local_50,(PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_160,
               (QPromiseResolve<int> *)&resolver_1,in_R8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_50);
    std::_Function_base::~_Function_base(&local_50.super__Function_base);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_218);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
               &local_160);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer
              ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)&p1);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver.m_d);
    local_200.d = (Data *)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p0.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    piVar7 = local_120;
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                );
    }
    QtPromise::QPromiseBase<int>::operator=
              (&p0.super_QPromiseBase<int>,(QPromiseBase<int> *)&local_200);
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_200);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_265_32_
              (&local_1a8);
    local_150 = CONCAT44(local_150._4_4_,(int)local_150 + 1);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&input.super_QPromiseBase<int>);
  }
  local_9c = 2;
  QtPromise::resolve<int>((QtPromise *)&p1,&local_9c);
  iVar6 = 0;
  for (local_150 = inputs.d.size << 2; local_150 != 0; local_150 = local_150 + -4) {
    local_120 = inputs.d.ptr;
    QtPromise::resolve<int_const&>((QtPromise *)&resolver,inputs.d.ptr);
    local_1a8.input.super_QPromiseBase<int>.m_d.d = local_140.d;
    if (local_140.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_140.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1a8.fn.called = (bool *)&v1;
    local_1a8.promise.super_QPromiseBase<int>.m_d.d = p1.super_QPromiseBase<int>.m_d.d;
    if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
                .super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1a8.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_160._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001348c0;
    local_1a8.idx = iVar6;
    pPVar4 = (PromiseData<int> *)operator_new(0x68);
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
         (void *)0x0;
    (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
    (pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
         (_func_int **)0x0;
    *(undefined8 *)&(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
    (pPVar4->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QtPromisePrivate::PromiseData<int>::PromiseData(pPVar4);
    LOCK();
    pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if (pPVar4 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &(pPVar4->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_200.d = (Data *)&PTR__QPromiseBase_00134920;
    local_200.ptr = (char16_t *)pPVar4;
    local_160.m_d.d = pPVar4;
    QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_200)
    ;
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&local_200);
    QVar2 = p1.super_QPromiseBase<int>.m_d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_218.d = (Data *)0x0;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_218 = resolver_1.m_d.d;
    }
    local_128.d = (Data *)0x0;
    if (local_218.d == (Data *)0x0) {
      local_1e8.reject.m_resolver.m_d.d =
           (PromiseResolver<int>)
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0;
    }
    else {
      LOCK();
      ((local_218.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_218.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_1e8.reject.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_218.d;
    }
    local_138.d = (Data *)0x0;
    if (local_218.d != (Data *)0x0) {
      LOCK();
      ((local_218.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
      super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           ((local_218.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (local_1e8.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      (((Data *)local_1e8.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>
      .super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_1e8.reject.m_resolver.m_d.d)->super_QSharedData).ref.
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.input.super_QPromiseBase<int>.m_d.d =
         local_1a8.input.super_QPromiseBase<int>.m_d.d;
    if (local_1a8.input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_1a8.input.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.input.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1e8.handler.fn.v1 = (QVector<int> *)local_1a8.fn.called;
    local_1e8.handler.promise.super_QPromiseBase<int>.m_d.d =
         local_1a8.promise.super_QPromiseBase<int>.m_d.d;
    if (local_1a8.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar1 = &((local_1a8.promise.super_QPromiseBase<int>.m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1e8.handler.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)&PTR__QPromiseBase_00134920;
    local_1e8.handler.idx = local_1a8.idx;
    local_118.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_118.super__Function_base._M_functor._8_8_ = (PromiseData<int> *)0x0;
    local_118.super__Function_base._M_manager = (_Manager_type)0x0;
    local_118._M_invoker = (_Invoker_type)0x0;
    local_1e8.resolve.m_resolver.m_d.d = (PromiseResolver<int>)(PromiseResolver<int>)local_218.d;
    local_130.d = (Data *)local_1e8.reject.m_resolver.m_d.d;
    pPVar5 = (PromiseResolver<int> *)operator_new(0x40);
    pPVar5->m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
                  local_1e8.resolve.m_resolver.m_d.d;
    if (local_1e8.resolve.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_1e8.resolve.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_1e8.resolve.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    pPVar5[1].m_d.d = (Data *)local_1e8.reject.m_resolver.m_d.d;
    if (local_1e8.reject.m_resolver.m_d.d !=
        (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
      LOCK();
      *(int *)local_1e8.reject.m_resolver.m_d.d =
           (int)*(QAtomicInt *)local_1e8.reject.m_resolver.m_d.d + 1;
      UNLOCK();
    }
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    _lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              ((anon_class_48_4_6432c65f_conflict1 *)(pPVar5 + 2),&local_1e8.handler);
    local_118._M_invoker =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_invoke;
    local_118.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
         ::_M_manager;
    local_118.super__Function_base._M_functor._M_unused._0_8_ = (undefined8)pPVar5;
    anon_func::anon_class_64_3_a63a5800::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromise_p_h_270_16_
              (&local_1e8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,&local_118);
    std::_Function_base::~_Function_base(&local_118.super__Function_base);
    QVar2 = p1.super_QPromiseBase<int>.m_d;
    QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
    create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
              ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&input,
               (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_218,
               (QPromiseResolve<int> *)&local_130,in_R8);
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
              (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
               (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&input);
    std::_Function_base::~_Function_base((_Function_base *)&input);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_130);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_138);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_218);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&local_128);
    QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
    ~QExplicitlySharedDataPointer(&resolver_1.m_d);
    local_160._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00134920;
    bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p1.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    if (!bVar3) {
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                (&(p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
                );
    }
    QtPromise::QPromiseBase<int>::operator=(&p1.super_QPromiseBase<int>,&local_160);
    QtPromise::QPromiseBase<int>::~QPromiseBase(&local_160);
    QtPromise::anon_func::anon_class_48_4_6432c65f::
    ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel_P_qtpromise_include____src_qtpromise_qpromisehelpers_h_234_32_
              (&local_1a8);
    iVar6 = iVar6 + 1;
    QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
    inputs.d.ptr = local_120 + 1;
  }
  bVar3 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p0.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
  local_1e8.resolve.m_resolver.m_d.d._0_1_ = bVar3;
  bVar3 = QTest::qCompare<bool,bool>
                    ((bool *)&local_1e8,(bool *)&local_1a8,"p0.isPending()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                     ,0xf6);
  if (bVar3) {
    local_1e8.resolve.m_resolver.m_d.d._0_1_ =
         QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                   (&(p1.super_QPromiseBase<int>.m_d.d)->
                     super_PromiseDataBase<int,_void_(const_int_&)>);
    local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 1;
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&local_1e8,(bool *)&local_1a8,"p1.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0xf7);
    if (bVar3) {
      local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 0;
      local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0;
      local_1a8.input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
      local_1a8.fn.called = (bool *)0x0;
      waitForError<int,QString>((QString *)&local_1e8,&p0,(QString *)&local_1a8);
      QString::QString((QString *)&local_200,"foo");
      bVar3 = QTest::qCompare((QString *)&local_1e8,(QString *)&local_200,
                              "waitForError(p0, QString{})","QString{\"foo\"}",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0xf8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
      if (bVar3) {
        local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 0;
        local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0;
        local_1a8.input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
        local_1a8.fn.called = (bool *)0x0;
        waitForError<int,QString>((QString *)&local_1e8,&p1,(QString *)&local_1a8);
        QString::QString((QString *)&local_200,"bar");
        bVar3 = QTest::qCompare((QString *)&local_1e8,(QString *)&local_200,
                                "waitForError(p1, QString{})","QString{\"bar\"}",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                ,0xf9);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_200);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1e8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
        if (bVar3) {
          local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 4;
          local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x6000000;
          local_1a8.input.super_QPromiseBase<int>.m_d.d._0_4_ = 1;
          args_00._M_len = 3;
          args_00._M_array = (iterator)&local_1a8;
          QList<int>::QList((QList<int> *)&local_1e8,args_00);
          bVar3 = QTest::qCompare<int>
                            (&v0,(QList<int> *)&local_1e8,"v0","(QVector<int>{4, 6, 1})",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                             ,0xfa);
          QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_1e8);
          if (bVar3) {
            local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._0_1_ = 2;
            local_1a8.input.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_ = 0x4000000;
            local_1a8.input.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x600000000;
            local_1a8.fn.called = (bool *)0x100000006;
            args_01._M_len = 6;
            args_01._M_array = (iterator)&local_1a8;
            QList<int>::QList((QList<int> *)&local_1e8,args_01);
            QTest::qCompare<int>
                      (&v1,(QList<int> *)&local_1e8,"v1","(QVector<int>{2, 4, 0, 6, 6, 1})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0xfb);
            QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_1e8);
          }
        }
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p0.super_QPromiseBase<int>);
  QArrayDataPointer<int>::~QArrayDataPointer(&v1.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&v0.d);
  QArrayDataPointer<int>::~QArrayDataPointer(&inputs.d);
  return;
}

Assistant:

void tst_helpers_reduce::delayedRejected()
{
    QVector<int> inputs{4, 6, 8};
    QVector<int> v0;
    QVector<int> v1;

    auto p0 = QtPromise::reduce(inputs, [&](int acc, int cur, int idx) {
        v0 << acc << cur << idx;
        if (cur == 6) {
            return QtPromise::QPromise<int>::reject(QString{"foo"});
        }
        return QtPromise::resolve(acc + cur + idx);
    });
    auto p1 = QtPromise::reduce(
        inputs,
        [&](int acc, int cur, int idx) {
            v1 << acc << cur << idx;
            if (cur == 6) {
                return QtPromise::QPromise<int>::reject(QString{"bar"});
            }
            return QtPromise::resolve(acc + cur + idx);
        },
        2);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<int>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<int>>::value));

    QCOMPARE(p0.isPending(), true);
    QCOMPARE(p1.isPending(), true);
    QCOMPARE(waitForError(p0, QString{}), QString{"foo"});
    QCOMPARE(waitForError(p1, QString{}), QString{"bar"});
    QCOMPARE(v0, (QVector<int>{4, 6, 1}));
    QCOMPARE(v1, (QVector<int>{2, 4, 0, 6, 6, 1}));
}